

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O3

expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::usdc::USDCReader::Impl::ToAPISchemas
          (expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Impl *this,ListOp<tinyusdz::Token> *arg,bool ignore_unknown,
          string *warn)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pTVar4;
  pointer pTVar5;
  undefined4 uVar6;
  ListEditQual LVar7;
  long *plVar8;
  _Alloc_hider _Var9;
  undefined7 in_register_00000009;
  ListOp<tinyusdz::Token> *extraout_RDX;
  ListOp<tinyusdz::Token> *extraout_RDX_00;
  ListOp<tinyusdz::Token> *extraout_RDX_01;
  ListOp<tinyusdz::Token> *extraout_RDX_02;
  ListOp<tinyusdz::Token> *extraout_RDX_03;
  ListOp<tinyusdz::Token> *extraout_RDX_04;
  ListOp<tinyusdz::Token> *extraout_RDX_05;
  ListOp<tinyusdz::Token> *extraout_RDX_06;
  ListOp<tinyusdz::Token> *extraout_RDX_07;
  ListOp<tinyusdz::Token> *extraout_RDX_08;
  ListOp<tinyusdz::Token> *extraout_RDX_09;
  ListOp<tinyusdz::Token> *extraout_RDX_10;
  ListOp<tinyusdz::Token> *extraout_RDX_11;
  ListOp<tinyusdz::Token> *extraout_RDX_12;
  ListOp<tinyusdz::Token> *extraout_RDX_13;
  ListOp<tinyusdz::Token> *extraout_RDX_14;
  ListOp<tinyusdz::Token> *extraout_RDX_15;
  ListOp<tinyusdz::Token> *extraout_RDX_16;
  ListOp<tinyusdz::Token> *extraout_RDX_17;
  ListOp<tinyusdz::Token> *extraout_RDX_18;
  ListOp<tinyusdz::Token> *extraout_RDX_19;
  ListOp<tinyusdz::Token> *extraout_RDX_20;
  ListOp<tinyusdz::Token> *extraout_RDX_21;
  ListOp<tinyusdz::Token> *extraout_RDX_22;
  undefined4 *puVar10;
  ListOp<tinyusdz::Token> *extraout_RDX_23;
  ListOp<tinyusdz::Token> *extraout_RDX_24;
  ListOp<tinyusdz::Token> *extraout_RDX_25;
  ListOp<tinyusdz::Token> *extraout_RDX_26;
  ListOp<tinyusdz::Token> *extraout_RDX_27;
  ListOp<tinyusdz::Token> *extraout_RDX_28;
  ListOp<tinyusdz::Token> *extraout_RDX_29;
  ListOp<tinyusdz::Token> *extraout_RDX_30;
  ListOp<tinyusdz::Token> *extraout_RDX_31;
  ListOp<tinyusdz::Token> *extraout_RDX_32;
  ListOp<tinyusdz::Token> *extraout_RDX_33;
  ListOp<tinyusdz::Token> *extraout_RDX_34;
  const_iterator __begin4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  string instanceName;
  APISchemas schemas;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  undefined1 local_a0 [12];
  undefined4 uStack_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68;
  undefined4 local_5c;
  undefined4 local_58;
  vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  string *local_38;
  
  local_5c = (undefined4)CONCAT71(in_register_00000009,ignore_unknown);
  local_58 = 0;
  local_50.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = warn;
  if (arg->is_explicit == true) {
    pbVar11 = &((arg->explicit_items).
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_start)->str_;
    pbVar3 = &((arg->explicit_items).
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_finish)->str_;
    local_68 = __return_storage_ptr__;
    if (pbVar11 != pbVar3) {
      paVar2 = &local_88.field_2;
      do {
        ToAPISchemas::anon_class_1_0_00000001::operator()
                  ((optional<tinyusdz::APISchemas::APIName> *)local_b0,
                   (anon_class_1_0_00000001 *)pbVar11,(token *)arg);
        if (local_b0[0] == ConnectableAPI) {
          uVar6 = local_b0._4_4_;
          local_88._M_dataplus._M_p = (pointer)paVar2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
          local_b0._0_4_ = uVar6;
          local_a8._M_p = local_a0 + 8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,local_88._M_dataplus._M_p,
                     local_88._M_dataplus._M_p + local_88._M_string_length);
          ::std::
          vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
          ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                    ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                      *)&local_50,
                     (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_b0);
          arg = extraout_RDX;
          if (local_a8._M_p != local_a0 + 8) {
            operator_delete(local_a8._M_p,stack0xffffffffffffff68 + 1);
            arg = extraout_RDX_00;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar2) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                     local_88.field_2._M_allocated_capacity._0_4_) + 1);
            arg = extraout_RDX_01;
          }
        }
        else {
          if ((char)local_5c == '\0') {
            ::std::operator+(&local_88,"Invalid or Unsupported API schema: ",pbVar11);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p == paVar2) {
              unique0x10000c1a = CONCAT44(local_88.field_2._12_4_,local_88.field_2._8_4_);
              _Var9._M_p = local_a0;
            }
            else {
              local_b0 = (undefined1  [8])local_88._M_dataplus._M_p;
              _Var9._M_p = local_88._M_dataplus._M_p;
            }
            local_a0._4_4_ = local_88.field_2._M_allocated_capacity._4_4_;
            local_a0._0_4_ = local_88.field_2._M_allocated_capacity._0_4_;
            (local_68->contained).
            super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value = false;
            puVar10 = (undefined4 *)
                      ((long)&(local_68->contained).
                              super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0 + 0x10);
            *(undefined4 **)
             &(local_68->contained).
              super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0 = puVar10;
            if (_Var9._M_p != local_a0) goto LAB_0017a064;
            goto LAB_0017a075;
          }
          ::std::operator+(&local_88,"Ignored unknown or unsupported API schema: ",pbVar11);
          plVar8 = (long *)::std::__cxx11::string::append((char *)&local_88);
          plVar1 = plVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar1) {
            local_a0._0_8_ = *plVar1;
            unique0x10000a4a = plVar8[3];
            local_b0 = (undefined1  [8])local_a0;
          }
          else {
            local_a0._0_8_ = *plVar1;
            local_b0 = (undefined1  [8])*plVar8;
          }
          local_a8._M_p = (pointer)plVar8[1];
          *plVar8 = (long)plVar1;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_38,(ulong)local_b0);
          arg = extraout_RDX_02;
          if (local_b0 != (undefined1  [8])local_a0) {
            operator_delete((void *)local_b0,(ulong)(local_a0._0_8_ + 1));
            arg = extraout_RDX_03;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar2) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                     local_88.field_2._M_allocated_capacity._0_4_) + 1);
            arg = extraout_RDX_04;
          }
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 != pbVar3);
    }
LAB_00179a42:
    local_58 = 0;
    LVar7 = ResetToExplicit;
  }
  else {
    pbVar11 = &((arg->explicit_items).
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_start)->str_;
    pbVar3 = &((arg->explicit_items).
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_finish)->str_;
    pbVar13 = &((arg->added_items).
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_finish)->str_;
    pbVar12 = &((arg->added_items).
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_start)->str_;
    if (pbVar3 != pbVar11) {
      if ((((pbVar13 != pbVar12) ||
           ((arg->appended_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (arg->appended_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_start)) ||
          ((arg->deleted_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->deleted_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start)) ||
         (((arg->prepended_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->prepended_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start ||
          ((arg->ordered_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->ordered_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start)))) {
LAB_0017a0e3:
        local_b0 = (undefined1  [8])0x3d6f49;
LAB_0017a0ea:
        nonstd::expected_lite::
        expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<const_char_*,_0>
                  (__return_storage_ptr__,(unexpected_type<const_char_*> *)local_b0);
        goto LAB_0017a0fa;
      }
      paVar2 = &local_88.field_2;
      local_68 = __return_storage_ptr__;
      do {
        ToAPISchemas::anon_class_1_0_00000001::operator()
                  ((optional<tinyusdz::APISchemas::APIName> *)local_b0,
                   (anon_class_1_0_00000001 *)pbVar11,(token *)arg);
        if (local_b0[0] == ConnectableAPI) {
          uVar6 = local_b0._4_4_;
          local_88._M_dataplus._M_p = (pointer)paVar2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
          local_b0._0_4_ = uVar6;
          local_a8._M_p = local_a0 + 8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,local_88._M_dataplus._M_p,
                     local_88._M_dataplus._M_p + local_88._M_string_length);
          ::std::
          vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
          ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                    ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                      *)&local_50,
                     (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_b0);
          arg = extraout_RDX_05;
          if (local_a8._M_p != local_a0 + 8) {
            operator_delete(local_a8._M_p,stack0xffffffffffffff68 + 1);
            arg = extraout_RDX_06;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar2) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                     local_88.field_2._M_allocated_capacity._0_4_) + 1);
            arg = extraout_RDX_07;
          }
        }
        else {
          if ((char)local_5c == '\0') goto LAB_0017a43a;
          ::std::operator+(&local_88,"Ignored unknown or unsupported API schema: ",pbVar11);
          plVar8 = (long *)::std::__cxx11::string::append((char *)&local_88);
          plVar1 = plVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar1) {
            local_a0._0_8_ = *plVar1;
            unique0x10000a8a = plVar8[3];
            local_b0 = (undefined1  [8])local_a0;
          }
          else {
            local_a0._0_8_ = *plVar1;
            local_b0 = (undefined1  [8])*plVar8;
          }
          local_a8._M_p = (pointer)plVar8[1];
          *plVar8 = (long)plVar1;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_38,(ulong)local_b0);
          arg = extraout_RDX_08;
          if (local_b0 != (undefined1  [8])local_a0) {
            operator_delete((void *)local_b0,(ulong)(local_a0._0_8_ + 1));
            arg = extraout_RDX_09;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar2) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                     local_88.field_2._M_allocated_capacity._0_4_) + 1);
            arg = extraout_RDX_10;
          }
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 != pbVar3);
      goto LAB_00179a42;
    }
    pbVar11 = &((arg->appended_items).
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_start)->str_;
    pbVar3 = &((arg->appended_items).
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_finish)->str_;
    if (pbVar13 == pbVar12) {
      pbVar13 = &((arg->deleted_items).
                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                  super__Vector_impl_data._M_start)->str_;
      pbVar12 = &((arg->deleted_items).
                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                  super__Vector_impl_data._M_finish)->str_;
      if (pbVar3 == pbVar11) {
        pbVar11 = &((arg->prepended_items).
                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                    super__Vector_impl_data._M_start)->str_;
        pbVar3 = &((arg->prepended_items).
                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                   super__Vector_impl_data._M_finish)->str_;
        if (pbVar12 == pbVar13) {
          pTVar4 = (arg->ordered_items).
                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pTVar5 = (arg->ordered_items).
                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pbVar3 == pbVar11) {
            if (pTVar5 == pTVar4) {
              local_b0 = (undefined1  [8])0x3d6fb4;
            }
            else {
              local_b0 = (undefined1  [8])0x3d6f98;
            }
            goto LAB_0017a0ea;
          }
          if (pTVar5 != pTVar4) goto LAB_0017a0e3;
          paVar2 = &local_88.field_2;
          local_68 = __return_storage_ptr__;
          do {
            ToAPISchemas::anon_class_1_0_00000001::operator()
                      ((optional<tinyusdz::APISchemas::APIName> *)local_b0,
                       (anon_class_1_0_00000001 *)pbVar11,(token *)arg);
            if (local_b0[0] == ConnectableAPI) {
              uVar6 = local_b0._4_4_;
              local_88._M_dataplus._M_p = (pointer)paVar2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
              local_b0._0_4_ = uVar6;
              local_a8._M_p = local_a0 + 8;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a8,local_88._M_dataplus._M_p,
                         local_88._M_dataplus._M_p + local_88._M_string_length);
              ::std::
              vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
              ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                        ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                          *)&local_50,
                         (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_b0);
              arg = extraout_RDX_29;
              if (local_a8._M_p != local_a0 + 8) {
                operator_delete(local_a8._M_p,stack0xffffffffffffff68 + 1);
                arg = extraout_RDX_30;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != paVar2) {
                operator_delete(local_88._M_dataplus._M_p,
                                CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                         local_88.field_2._M_allocated_capacity._0_4_) + 1);
                arg = extraout_RDX_31;
              }
            }
            else {
              if ((char)local_5c == '\0') goto LAB_0017a43a;
              ::std::operator+(&local_88,"Ignored unknown or unsupported API schema: ",pbVar11);
              plVar8 = (long *)::std::__cxx11::string::append((char *)&local_88);
              plVar1 = plVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar1) {
                local_a0._0_8_ = *plVar1;
                unique0x10000b2a = plVar8[3];
                local_b0 = (undefined1  [8])local_a0;
              }
              else {
                local_a0._0_8_ = *plVar1;
                local_b0 = (undefined1  [8])*plVar8;
              }
              local_a8._M_p = (pointer)plVar8[1];
              *plVar8 = (long)plVar1;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_38,(ulong)local_b0);
              arg = extraout_RDX_32;
              if (local_b0 != (undefined1  [8])local_a0) {
                operator_delete((void *)local_b0,(ulong)(local_a0._0_8_ + 1));
                arg = extraout_RDX_33;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != paVar2) {
                operator_delete(local_88._M_dataplus._M_p,
                                CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                         local_88.field_2._M_allocated_capacity._0_4_) + 1);
                arg = extraout_RDX_34;
              }
            }
            pbVar11 = pbVar11 + 1;
          } while (pbVar11 != pbVar3);
          local_58 = 4;
          LVar7 = Prepend;
        }
        else {
          if ((pbVar3 != pbVar11) ||
             ((arg->ordered_items).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (arg->ordered_items).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_start)) goto LAB_0017a0a4;
          paVar2 = &local_88.field_2;
          local_68 = __return_storage_ptr__;
          do {
            ToAPISchemas::anon_class_1_0_00000001::operator()
                      ((optional<tinyusdz::APISchemas::APIName> *)local_b0,
                       (anon_class_1_0_00000001 *)pbVar13,(token *)arg);
            if (local_b0[0] == ConnectableAPI) {
              uVar6 = local_b0._4_4_;
              local_88._M_dataplus._M_p = (pointer)paVar2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
              local_b0._0_4_ = uVar6;
              local_a8._M_p = local_a0 + 8;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a8,local_88._M_dataplus._M_p,
                         local_88._M_dataplus._M_p + local_88._M_string_length);
              ::std::
              vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
              ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                        ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                          *)&local_50,
                         (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_b0);
              arg = extraout_RDX_23;
              if (local_a8._M_p != local_a0 + 8) {
                operator_delete(local_a8._M_p,stack0xffffffffffffff68 + 1);
                arg = extraout_RDX_24;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != paVar2) {
                operator_delete(local_88._M_dataplus._M_p,
                                CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                         local_88.field_2._M_allocated_capacity._0_4_) + 1);
                arg = extraout_RDX_25;
              }
            }
            else {
              if ((char)local_5c == '\0') {
                ::std::operator+(&local_88,"Invalid or Unsupported API schema: ",pbVar13);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p == paVar2) goto LAB_0017a507;
                goto LAB_0017a4bd;
              }
              ::std::operator+(&local_88,"Ignored unknown or unsupported API schema: ",pbVar13);
              plVar8 = (long *)::std::__cxx11::string::append((char *)&local_88);
              plVar1 = plVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar1) {
                local_a0._0_8_ = *plVar1;
                unique0x10000b0a = plVar8[3];
                local_b0 = (undefined1  [8])local_a0;
              }
              else {
                local_a0._0_8_ = *plVar1;
                local_b0 = (undefined1  [8])*plVar8;
              }
              local_a8._M_p = (pointer)plVar8[1];
              *plVar8 = (long)plVar1;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_38,(ulong)local_b0);
              arg = extraout_RDX_26;
              if (local_b0 != (undefined1  [8])local_a0) {
                operator_delete((void *)local_b0,(ulong)(local_a0._0_8_ + 1));
                arg = extraout_RDX_27;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != paVar2) {
                operator_delete(local_88._M_dataplus._M_p,
                                CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                         local_88.field_2._M_allocated_capacity._0_4_) + 1);
                arg = extraout_RDX_28;
              }
            }
            pbVar13 = pbVar13 + 1;
          } while (pbVar13 != pbVar12);
          local_58 = 3;
          LVar7 = Delete;
        }
      }
      else {
        if (((pbVar12 != pbVar13) ||
            ((arg->prepended_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             (arg->prepended_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_start)) ||
           ((arg->ordered_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (arg->ordered_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_start)) {
LAB_0017a0a4:
          local_b0 = (undefined1  [8])0x3d6f49;
          nonstd::expected_lite::
          expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<const_char_*,_0>
                    (__return_storage_ptr__,(unexpected_type<const_char_*> *)local_b0);
          goto LAB_0017a0fa;
        }
        paVar2 = &local_88.field_2;
        local_68 = __return_storage_ptr__;
        do {
          ToAPISchemas::anon_class_1_0_00000001::operator()
                    ((optional<tinyusdz::APISchemas::APIName> *)local_b0,
                     (anon_class_1_0_00000001 *)pbVar11,(token *)arg);
          if (local_b0[0] == ConnectableAPI) {
            uVar6 = local_b0._4_4_;
            local_88._M_dataplus._M_p = (pointer)paVar2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
            local_b0._0_4_ = uVar6;
            local_a8._M_p = local_a0 + 8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a8,local_88._M_dataplus._M_p,
                       local_88._M_dataplus._M_p + local_88._M_string_length);
            ::std::
            vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
            ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                      ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                        *)&local_50,
                       (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_b0);
            arg = extraout_RDX_17;
            if (local_a8._M_p != local_a0 + 8) {
              operator_delete(local_a8._M_p,stack0xffffffffffffff68 + 1);
              arg = extraout_RDX_18;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != paVar2) {
              operator_delete(local_88._M_dataplus._M_p,
                              CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                       local_88.field_2._M_allocated_capacity._0_4_) + 1);
              arg = extraout_RDX_19;
            }
          }
          else {
            if ((char)local_5c == '\0') goto LAB_0017a43a;
            ::std::operator+(&local_88,"Ignored unknown or unsupported API schema: ",pbVar11);
            plVar8 = (long *)::std::__cxx11::string::append((char *)&local_88);
            plVar1 = plVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar1) {
              local_a0._0_8_ = *plVar1;
              unique0x10000aca = plVar8[3];
              local_b0 = (undefined1  [8])local_a0;
            }
            else {
              local_a0._0_8_ = *plVar1;
              local_b0 = (undefined1  [8])*plVar8;
            }
            local_a8._M_p = (pointer)plVar8[1];
            *plVar8 = (long)plVar1;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_38,(ulong)local_b0);
            arg = extraout_RDX_20;
            if (local_b0 != (undefined1  [8])local_a0) {
              operator_delete((void *)local_b0,(ulong)(local_a0._0_8_ + 1));
              arg = extraout_RDX_21;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != paVar2) {
              operator_delete(local_88._M_dataplus._M_p,
                              CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                       local_88.field_2._M_allocated_capacity._0_4_) + 1);
              arg = extraout_RDX_22;
            }
          }
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 != pbVar3);
        local_58 = 1;
        LVar7 = Append;
      }
    }
    else {
      if (((pbVar3 != pbVar11) ||
          ((arg->deleted_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->deleted_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start)) ||
         (((arg->prepended_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->prepended_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start ||
          ((arg->ordered_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->ordered_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start)))) goto LAB_0017a0e3;
      paVar2 = &local_88.field_2;
      local_68 = __return_storage_ptr__;
      do {
        ToAPISchemas::anon_class_1_0_00000001::operator()
                  ((optional<tinyusdz::APISchemas::APIName> *)local_b0,
                   (anon_class_1_0_00000001 *)pbVar12,(token *)arg);
        if (local_b0[0] == ConnectableAPI) {
          uVar6 = local_b0._4_4_;
          local_88._M_dataplus._M_p = (pointer)paVar2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
          local_b0._0_4_ = uVar6;
          local_a8._M_p = local_a0 + 8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,local_88._M_dataplus._M_p,
                     local_88._M_dataplus._M_p + local_88._M_string_length);
          ::std::
          vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
          ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                    ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                      *)&local_50,
                     (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_b0);
          arg = extraout_RDX_11;
          if (local_a8._M_p != local_a0 + 8) {
            operator_delete(local_a8._M_p,stack0xffffffffffffff68 + 1);
            arg = extraout_RDX_12;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar2) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                     local_88.field_2._M_allocated_capacity._0_4_) + 1);
            arg = extraout_RDX_13;
          }
        }
        else {
          if ((char)local_5c == '\0') {
            ::std::operator+(&local_88,"Invalid or Unsupported API schema: ",pbVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p == paVar2) {
              unique0x10000c22 = CONCAT44(local_88.field_2._12_4_,local_88.field_2._8_4_);
              _Var9._M_p = (pointer)local_a0;
            }
            else {
              local_b0 = (undefined1  [8])local_88._M_dataplus._M_p;
              _Var9._M_p = local_88._M_dataplus._M_p;
            }
            local_a0._4_4_ = local_88.field_2._M_allocated_capacity._4_4_;
            local_a0._0_4_ = local_88.field_2._M_allocated_capacity._0_4_;
            (local_68->contained).
            super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value = false;
            puVar10 = (undefined4 *)
                      ((long)&(local_68->contained).
                              super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0 + 0x10);
            *(undefined4 **)
             &(local_68->contained).
              super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0 = puVar10;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var9._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0) goto LAB_0017a064;
            goto LAB_0017a075;
          }
          ::std::operator+(&local_88,"Ignored unknown or unsupported API schema: ",pbVar12);
          plVar8 = (long *)::std::__cxx11::string::append((char *)&local_88);
          plVar1 = plVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar1) {
            local_a0._0_8_ = *plVar1;
            unique0x10000aaa = plVar8[3];
            local_b0 = (undefined1  [8])local_a0;
          }
          else {
            local_a0._0_8_ = *plVar1;
            local_b0 = (undefined1  [8])*plVar8;
          }
          local_a8._M_p = (pointer)plVar8[1];
          *plVar8 = (long)plVar1;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_38,(ulong)local_b0);
          arg = extraout_RDX_14;
          if (local_b0 != (undefined1  [8])local_a0) {
            operator_delete((void *)local_b0,(ulong)(local_a0._0_8_ + 1));
            arg = extraout_RDX_15;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar2) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                     local_88.field_2._M_allocated_capacity._0_4_) + 1);
            arg = extraout_RDX_16;
          }
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 != pbVar13);
      local_58 = 2;
      LVar7 = Add;
    }
  }
  (local_68->contained).
  super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  (local_68->contained).
  super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value.listOpQual = LVar7;
  (local_68->contained).
  super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value.names.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_50.
       super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(local_68->contained).
           super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .field_0.m_value.names.
           super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data + 8) =
       local_50.
       super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(local_68->contained).
           super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .field_0.m_value.names.
           super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) =
       local_50.
       super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_50.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__ = local_68;
LAB_0017a0fa:
  ::std::
  vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_50);
  return __return_storage_ptr__;
LAB_0017a43a:
  ::std::operator+(&local_88,"Invalid or Unsupported API schema: ",pbVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == &local_88.field_2) {
LAB_0017a507:
    local_a0._4_4_ = local_88.field_2._M_allocated_capacity._4_4_;
    local_a0._0_4_ = local_88.field_2._M_allocated_capacity._0_4_;
    uStack_94 = local_88.field_2._12_4_;
    local_a0._8_4_ = local_88.field_2._8_4_;
    _Var9._M_p = (pointer)local_a0;
  }
  else {
LAB_0017a4bd:
    local_b0 = (undefined1  [8])local_88._M_dataplus._M_p;
    local_a0._0_8_ =
         CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                  local_88.field_2._M_allocated_capacity._0_4_);
    _Var9._M_p = local_88._M_dataplus._M_p;
  }
  (local_68->contained).
  super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = false;
  puVar10 = (undefined4 *)
            ((long)&(local_68->contained).
                    super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0 + 0x10);
  *(undefined4 **)
   &(local_68->contained).
    super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0 = puVar10;
  if (_Var9._M_p == local_a0) {
    local_88.field_2._M_allocated_capacity._0_4_ = local_a0._0_4_;
    local_88.field_2._M_allocated_capacity._4_4_ = local_a0._4_4_;
LAB_0017a075:
    *puVar10 = local_88.field_2._M_allocated_capacity._0_4_;
    puVar10[1] = local_88.field_2._M_allocated_capacity._4_4_;
    puVar10[2] = local_a0._8_4_;
    puVar10[3] = uStack_94;
  }
  else {
LAB_0017a064:
    (local_68->contained).
    super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_dataplus._M_p = _Var9._M_p;
    *(undefined8 *)
     ((long)&(local_68->contained).
             super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0.m_value.names.
             super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data + 8) = local_a0._0_8_;
  }
  (local_68->contained).
  super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value.names.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._M_string_length;
  __return_storage_ptr__ = local_68;
  goto LAB_0017a0fa;
}

Assistant:

nonstd::expected<APISchemas, std::string> USDCReader::Impl::ToAPISchemas(
    const ListOp<value::token> &arg, bool ignore_unknown, std::string &warn) {
  APISchemas schemas;

  auto SchemaHandler =
      [](const value::token &tok) -> nonstd::optional<APISchemas::APIName> {
    if (tok.str() == "MaterialBindingAPI") {
      return APISchemas::APIName::MaterialBindingAPI;
    } else if (tok.str() == "NodeDefAPI") {
      return APISchemas::APIName::NodeDefAPI;
    } else if (tok.str() == "CoordSysAPI") {
      return APISchemas::APIName::CoordSysAPI;
    } else if (tok.str() == "ConnectableAPI") {
      return APISchemas::APIName::ConnectableAPI;
    } else if (tok.str() == "CollectionAPI") {
      return APISchemas::APIName::CollectionAPI;
    } else if (tok.str() == "SkelBindingAPI") {
      return APISchemas::APIName::SkelBindingAPI;
    } else if (tok.str() == "VisibilityAPI") {
      return APISchemas::APIName::VisibilityAPI;
    } else if (tok.str() == "GeomModelAPI") {
      return APISchemas::APIName::GeomModelAPI;
    } else if (tok.str() == "MotionAPI") {
      return APISchemas::APIName::MotionAPI;
    } else if (tok.str() == "PrimvarsAPI") {
      return APISchemas::APIName::PrimvarsAPI;
    } else if (tok.str() == "XformCommonAPI") {
      return APISchemas::APIName::XformCommonAPI;
    } else if (tok.str() == "ListAPI") {
      return APISchemas::APIName::ListAPI;
    } else if (tok.str() == "LightListAPI") {
      return APISchemas::APIName::LightListAPI;
    } else if (tok.str() == "LightAPI") {
      return APISchemas::APIName::LightAPI;
    } else if (tok.str() == "MeshLightAPI") {
      return APISchemas::APIName::MeshLightAPI;
    } else if (tok.str() == "VolumeLightAPI") {
      return APISchemas::APIName::VolumeLightAPI;
    } else if (tok.str() == "ConnectableAPI") {
      return APISchemas::APIName::ConnectableAPI;
    } else if (tok.str() == "ShadowAPI") {
      return APISchemas::APIName::ShadowAPI;
    } else if (tok.str() == "ShapingAPI") {
      return APISchemas::APIName::ShapingAPI;
    } else if (tok.str() == "Preliminary_AnchoringAPI") {
      return APISchemas::APIName::Preliminary_AnchoringAPI;
    } else if (tok.str() == "Preliminary_PhysicsColliderAPI") {
      return APISchemas::APIName::Preliminary_PhysicsColliderAPI;
    } else if (tok.str() == "Preliminary_PhysicsMaterialAPI") {
      return APISchemas::APIName::Preliminary_PhysicsMaterialAPI;
    } else if (tok.str() == "Preliminary_PhysicsRigidBodyAPI") {
      return APISchemas::APIName::Preliminary_PhysicsRigidBodyAPI;
    } else {
      return nonstd::nullopt;
    }
  };

  if (arg.IsExplicit()) {  // fast path
    for (auto &item : arg.GetExplicitItems()) {
      if (auto pv = SchemaHandler(item)) {
        std::string instanceName = "";  // TODO
        schemas.names.push_back({pv.value(), instanceName});
      } else if (ignore_unknown) {
        warn += "Ignored unknown or unsupported API schema: " +
                                       item.str() + "\n";
      } else {
        return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                       item.str());
      }
    }
    schemas.listOpQual = ListEditQual::ResetToExplicit;

  } else {
    // Assume all items have same ListEdit qualifier.
    if (arg.GetExplicitItems().size()) {
      if (arg.GetAddedItems().size() || arg.GetAppendedItems().size() ||
          arg.GetDeletedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetExplicitItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::ResetToExplicit;

    } else if (arg.GetAddedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAppendedItems().size() ||
          arg.GetDeletedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &item : arg.GetAddedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Add;
    } else if (arg.GetAppendedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetDeletedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetAppendedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Append;
    } else if (arg.GetDeletedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetAppendedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetDeletedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Delete;
    } else if (arg.GetPrependedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetAppendedItems().size() || arg.GetDeletedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetPrependedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Prepend;
    } else if (arg.GetOrderedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetAppendedItems().size() || arg.GetDeletedItems().size() ||
          arg.GetPrependedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }

      // schemas.qual = ListEditQual::Order;
      return nonstd::make_unexpected("TODO: Ordered ListOp items.");
    } else {
      // ??? This should not happend.
      return nonstd::make_unexpected("Internal error: ListOp conversion.");
    }
  }

  return std::move(schemas);
}